

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

bool __thiscall
QItemSelectionRangeRefCache::contains
          (QItemSelectionRangeRefCache *this,int row,int column,QModelIndex *parentIndex)

{
  bool bVar1;
  QModelIndex *lhs;
  
  populate(this);
  if ((((row <= this->m_bottom) && (column <= this->m_right)) && (this->m_top <= row)) &&
     (this->m_left <= column)) {
    lhs = parent(this);
    bVar1 = ::comparesEqual(lhs,parentIndex);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool contains(int row, int column, const QModelIndex &parentIndex)
    {
        populate();
        return (m_bottom >= row && m_right >= column &&
                m_top    <= row && m_left  <= column &&
                parent() == parentIndex);
    }